

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

CasePropertyExprSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::CasePropertyExprSyntax,slang::parsing::Token,slang::parsing::Token,slang::syntax::ExpressionSyntax&,slang::parsing::Token,slang::syntax::SyntaxList<slang::syntax::PropertyCaseItemSyntax>&,slang::parsing::Token>
          (BumpAllocator *this,Token *args,Token *args_1,ExpressionSyntax *args_2,Token *args_3,
          SyntaxList<slang::syntax::PropertyCaseItemSyntax> *args_4,Token *args_5)

{
  Token caseKeyword;
  Token openParen;
  Token closeParen;
  Token endcase;
  CasePropertyExprSyntax *this_00;
  
  this_00 = (CasePropertyExprSyntax *)allocate(this,0x98,8);
  caseKeyword.kind = args->kind;
  caseKeyword._2_1_ = args->field_0x2;
  caseKeyword.numFlags.raw = (args->numFlags).raw;
  caseKeyword.rawLen = args->rawLen;
  caseKeyword.info = args->info;
  openParen.kind = args_1->kind;
  openParen._2_1_ = args_1->field_0x2;
  openParen.numFlags.raw = (args_1->numFlags).raw;
  openParen.rawLen = args_1->rawLen;
  openParen.info = args_1->info;
  endcase.kind = args_5->kind;
  endcase._2_1_ = args_5->field_0x2;
  endcase.numFlags.raw = (args_5->numFlags).raw;
  endcase.rawLen = args_5->rawLen;
  endcase.info = args_5->info;
  closeParen.kind = args_3->kind;
  closeParen._2_1_ = args_3->field_0x2;
  closeParen.numFlags.raw = (args_3->numFlags).raw;
  closeParen.rawLen = args_3->rawLen;
  closeParen.info = args_3->info;
  slang::syntax::CasePropertyExprSyntax::CasePropertyExprSyntax
            (this_00,caseKeyword,openParen,args_2,closeParen,args_4,endcase);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }